

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Path * Path::resolved(Path *__return_storage_ptr__,String *path,ResolveMode mode,Path *cwd,bool *ok)

{
  bool bVar1;
  bool *ok_local;
  Path *cwd_local;
  ResolveMode mode_local;
  String *path_local;
  Path *ret;
  
  Path(__return_storage_ptr__,path);
  bVar1 = resolve(__return_storage_ptr__,mode,cwd,(bool *)0x0);
  if ((bVar1) && (ok != (bool *)0x0)) {
    *ok = true;
  }
  else if (ok != (bool *)0x0) {
    *ok = false;
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::resolved(const String &path, ResolveMode mode, const Path &cwd, bool *ok)
{
    Path ret(path);
    if (ret.resolve(mode, cwd) && ok) {
        *ok = true;
    } else if (ok) {
        *ok = false;
    }
    return ret;
}